

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

uint8_t * EmitVP8XChunk(uint8_t *dst,int width,int height,uint32_t flags)

{
  long in_RDI;
  size_t vp8x_size;
  uint32_t in_stack_ffffffffffffffdc;
  uint8_t *data;
  
  data = (uint8_t *)0x12;
  PutLE32((uint8_t *)0x12,in_stack_ffffffffffffffdc);
  PutLE32(data,in_stack_ffffffffffffffdc);
  PutLE32(data,in_stack_ffffffffffffffdc);
  PutLE24(data,in_stack_ffffffffffffffdc);
  PutLE24(data,in_stack_ffffffffffffffdc);
  return (uint8_t *)(in_RDI + 0x12);
}

Assistant:

static uint8_t* EmitVP8XChunk(uint8_t* const dst, int width,
                              int height, uint32_t flags) {
  const size_t vp8x_size = CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  assert(width >= 1 && height >= 1);
  assert(width <= MAX_CANVAS_SIZE && height <= MAX_CANVAS_SIZE);
  assert(width * (uint64_t)height < MAX_IMAGE_AREA);
  PutLE32(dst, MKFOURCC('V', 'P', '8', 'X'));
  PutLE32(dst + TAG_SIZE, VP8X_CHUNK_SIZE);
  PutLE32(dst + CHUNK_HEADER_SIZE, flags);
  PutLE24(dst + CHUNK_HEADER_SIZE + 4, width - 1);
  PutLE24(dst + CHUNK_HEADER_SIZE + 7, height - 1);
  return dst + vp8x_size;
}